

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyHttpImplPrivate::~QNetworkReplyHttpImplPrivate(QNetworkReplyHttpImplPrivate *this)

{
  QSslConfiguration *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Data *pDVar2;
  
  *(undefined ***)&this->super_QNetworkReplyPrivate = &PTR__QNetworkReplyHttpImplPrivate_002cf4b8;
  QDecompressHelper::~QDecompressHelper(&this->decompressHelper);
  QNetworkRequest::~QNetworkRequest(&this->redirectRequest);
  QArrayDataPointer<QSslError>::~QArrayDataPointer(&(this->pendingIgnoreSslErrorsList).d);
  this_00 = (this->sslConfiguration).d;
  if (this_00 != (QSslConfiguration *)0x0) {
    QSslConfiguration::~QSslConfiguration(this_00);
  }
  operator_delete(this_00,8);
  p_Var1 = (this->pendingDownloadProgressEmissions).
           super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->pendingDownloadDataEmissions).
           super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  QSharedPointer<char>::deref((this->downloadBufferPointer).d);
  QNetworkProxy::~QNetworkProxy(&this->lastProxyAuthentication);
  QUrl::~QUrl(&this->urlForLastAuthentication);
  p_Var1 = (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->uploadByteDevice).
           super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pDVar2 = (this->reasonPhrase).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->reasonPhrase).d.d)->super_QArrayData,2,0x10);
    }
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&this->httpRequest);
  QNetworkReplyPrivate::~QNetworkReplyPrivate(&this->super_QNetworkReplyPrivate);
  return;
}

Assistant:

QNetworkReplyHttpImplPrivate::~QNetworkReplyHttpImplPrivate()
{
}